

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O3

CharGroup_ * __thiscall
kj::parse::CharGroup_::orAny(CharGroup_ *__return_storage_ptr__,CharGroup_ *this,char *chars)

{
  byte bVar1;
  Bits64 BVar2;
  Bits64 BVar3;
  Bits64 BVar4;
  ulong uVar5;
  CharGroup_ local_28;
  
  bVar1 = *chars;
  if (bVar1 == 0) {
    BVar2 = this->bits[0];
    BVar3 = this->bits[1];
    BVar4 = this->bits[3];
    __return_storage_ptr__->bits[2] = this->bits[2];
    __return_storage_ptr__->bits[3] = BVar4;
    __return_storage_ptr__->bits[0] = BVar2;
    __return_storage_ptr__->bits[1] = BVar3;
  }
  else {
    uVar5 = 0;
    local_28.bits[0] = 1L << (bVar1 & 0x3f);
    if (0x3f < bVar1) {
      local_28.bits[0] = uVar5;
    }
    local_28.bits[0] = local_28.bits[0] | this->bits[0];
    local_28.bits[1] = 1L << (bVar1 & 0x3f);
    if (0x3f < bVar1 - 0x40) {
      local_28.bits[1] = uVar5;
    }
    local_28.bits[1] = local_28.bits[1] | this->bits[1];
    local_28.bits[2] = 1L << (bVar1 & 0x3f);
    if (0x3f < bVar1 - 0x80) {
      local_28.bits[2] = uVar5;
    }
    local_28.bits[2] = local_28.bits[2] | this->bits[2];
    local_28.bits[3] = this->bits[3];
    orAny(__return_storage_ptr__,&local_28,chars + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr inline CharGroup_ orAny(const char* chars) const {
    return *chars == 0 ? *this : orChar(*chars).orAny(chars + 1);
  }